

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MarchingCube.cpp
# Opt level: O0

vec3 __thiscall
MarchingCube::computeNormal(MarchingCube *this,Field<double,_unsigned_short> *F,vec3 p)

{
  double dVar1;
  double dVar2;
  vec<3,_float,_(glm::qualifier)0> vVar3;
  vec3 vVar4;
  vec<3,_float,_(glm::qualifier)0> local_74;
  undefined8 local_68;
  double eps;
  double divz;
  double divy;
  double divx;
  Field<double,_unsigned_short> *F_local;
  MarchingCube *this_local;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_30;
  undefined8 local_28;
  vec3 p_local;
  undefined8 uVar5;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar6;
  
  local_30 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)p.field_2;
  this_local = p._0_8_;
  divy = 0.0;
  divz = 0.0;
  eps = 0.0;
  local_68 = 0x3fe0000000000000;
  local_28._0_4_ = p.field_0;
  local_28._4_4_ = p.field_1;
  dVar1 = (double)local_28._0_4_;
  dVar2 = (double)local_28._4_4_;
  divx = (double)F;
  F_local = (Field<double,_unsigned_short> *)this;
  local_28 = this_local;
  p_local.field_0 = local_30;
  dVar1 = interp(this,F,dVar1 + 0.5,dVar2,(double)local_30.x);
  dVar2 = interp(this,(Field<double,_unsigned_short> *)divx,(double)local_28._0_4_ - 0.5,
                 (double)local_28._4_4_,(double)p_local.field_0.x);
  divy = dVar1 - dVar2;
  dVar1 = interp(this,(Field<double,_unsigned_short> *)divx,(double)local_28._0_4_,
                 (double)local_28._4_4_ + 0.5,(double)p_local.field_0.x);
  dVar2 = interp(this,(Field<double,_unsigned_short> *)divx,(double)local_28._0_4_,
                 (double)local_28._4_4_ - 0.5,(double)p_local.field_0.x);
  divz = dVar1 - dVar2;
  dVar1 = interp(this,(Field<double,_unsigned_short> *)divx,(double)local_28._0_4_,
                 (double)local_28._4_4_,(double)p_local.field_0.x + 0.5);
  dVar2 = interp(this,(Field<double,_unsigned_short> *)divx,(double)local_28._0_4_,
                 (double)local_28._4_4_,(double)p_local.field_0.x - 0.5);
  eps = dVar1 - dVar2;
  glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
            ((vec<3,float,(glm::qualifier)0> *)&local_74,divy,divz,eps);
  vVar3 = glm::normalize<3,float,(glm::qualifier)0>(&local_74);
  vVar4.field_0 = vVar3.field_0;
  uVar5._4_4_ = vVar3.field_1;
  register0x00001240 = vVar3.field_2;
  return vVar4;
}

Assistant:

inline glm::vec3 MarchingCube::computeNormal(
        const Field<double, std::uint16_t>& F,
        const glm::vec3 p
    ) const
{
    double divx = 0;
    double divy = 0;
    double divz = 0;
    double const eps = 0.5;
    divx = interp(F, p.x+eps, p.y, p.z) - interp(F, p.x-eps, p.y, p.z);
    divy = interp(F, p.x, p.y+eps, p.z) - interp(F, p.x, p.y-eps, p.z);
    divz = interp(F, p.x, p.y, p.z+eps) - interp(F, p.x, p.y, p.z-eps);
    return glm::normalize(glm::vec3 {divx, divy, divz});
}